

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O0

QpVector *
computesearchdirection_major
          (Runtime *runtime,Basis *basis,CholeskyFactor *factor,QpVector *yp,Gradient *gradient,
          QpVector *gyp,QpVector *l,QpVector *m,QpVector *p)

{
  HighsInt HVar1;
  long in_RDI;
  double dVar2;
  QpVector v;
  QpVector yyp;
  QpVector *in_stack_ffffffffffffff08;
  Matrix *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  QpVector *in_stack_ffffffffffffff20;
  QpVector *in_stack_ffffffffffffff28;
  CholeskyFactor *in_stack_ffffffffffffff30;
  QpVector *other;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QpVector *in_stack_ffffffffffffff48;
  Basis *in_stack_ffffffffffffff50;
  QpVector local_70;
  long local_10;
  QpVector *local_8;
  
  other = &local_70;
  local_10 = in_RDI;
  QpVector::QpVector((QpVector *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Matrix::mat_vec(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(QpVector *)0x75dde7);
  HVar1 = Basis::getnumactive((Basis *)0x75ddf6);
  if (HVar1 < *(int *)(local_10 + 4)) {
    Basis::Ztprod(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                  (QpVector *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  SUB81((ulong)other >> 0x38,0),(HighsInt)other);
    QpVector::operator=((QpVector *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    CholeskyFactor::solveL(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    QpVector::QpVector((QpVector *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    CholeskyFactor::solveLT
              ((CholeskyFactor *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),other
              );
    Basis::Zprod((Basis *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),other,
                 (QpVector *)in_stack_ffffffffffffff30);
    Gradient::getGradient((Gradient *)in_stack_ffffffffffffff10);
    dVar2 = QpVector::dot((QpVector *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          other);
    if (0.0 <= dVar2) {
      local_8 = QpVector::saxpy(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                (double)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      local_8 = QpVector::saxpy(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                (double)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    QpVector::~QpVector((QpVector *)in_stack_ffffffffffffff10);
  }
  else {
    QpVector::repopulate
              ((QpVector *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),other);
    in_stack_ffffffffffffff10 =
         (Matrix *)Gradient::getGradient((Gradient *)in_stack_ffffffffffffff10);
    QpVector::dot((QpVector *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),other);
    local_8 = QpVector::scale((QpVector *)in_stack_ffffffffffffff30,
                              (double)in_stack_ffffffffffffff28);
  }
  QpVector::~QpVector((QpVector *)in_stack_ffffffffffffff10);
  return local_8;
}

Assistant:

static QpVector& computesearchdirection_major(
    Runtime& runtime, Basis& basis, CholeskyFactor& factor, const QpVector& yp,
    Gradient& gradient, QpVector& gyp, QpVector& l, QpVector& m, QpVector& p) {
  QpVector yyp = yp;  // TODO PERF: buffer QpVector
  // if (gradient.getGradient().dot(yp) > 0.0) {
  //   yyp.scale(-1.0);
  // }
  runtime.instance.Q.mat_vec(yyp, gyp);
  if (basis.getnumactive() < runtime.instance.num_var) {
    basis.Ztprod(gyp, m);
    l = m;
    factor.solveL(l);
    QpVector v = l;  // TODO PERF: buffer QpVector
    factor.solveLT(v);
    basis.Zprod(v, p);
    if (gradient.getGradient().dot(yyp) < 0.0) {
      return p.saxpy(-1.0, 1.0, yyp);
    } else {
      return p.saxpy(-1.0, -1.0, yyp);
    }

  } else {
    return p.repopulate(yp).scale(-gradient.getGradient().dot(yp));
    // return -yp;
  }
}